

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

VkBool32 __thiscall
vkb::default_debug_callback
          (vkb *this,VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity,
          VkDebugUtilsMessageTypeFlagsEXT messageType,
          VkDebugUtilsMessengerCallbackDataEXT *pCallbackData,void *param_4)

{
  char *pcVar1;
  undefined4 in_register_00000014;
  long lVar2;
  int iVar3;
  char *pcVar4;
  
  lVar2 = CONCAT44(in_register_00000014,messageType);
  iVar3 = (int)this;
  if (iVar3 < 0x100) {
    if (iVar3 == 1) {
      pcVar1 = "VERBOSE";
      goto LAB_00121fa6;
    }
    if (iVar3 == 0x10) {
      pcVar1 = "INFO";
      goto LAB_00121fa6;
    }
  }
  else {
    if (iVar3 == 0x100) {
      pcVar1 = "WARNING";
      goto LAB_00121fa6;
    }
    if (iVar3 == 0x1000) {
      pcVar1 = "ERROR";
      goto LAB_00121fa6;
    }
  }
  pcVar1 = "UNKNOWN";
LAB_00121fa6:
  if (messageSeverity - VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT < 7) {
    pcVar4 = *(char **)(&DAT_0015cc70 +
                       (ulong)(messageSeverity - VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT) *
                       8);
  }
  else {
    pcVar4 = "Unknown";
  }
  if ((messageSeverity & 2) == 0) {
    printf("[%s: %s]\n%s\n",pcVar1,pcVar4,*(undefined8 *)(lVar2 + 0x28),param_4,pcVar4,pcVar1);
  }
  else {
    printf("[%s: %s] - %s\n%s\n",pcVar1,pcVar4,*(undefined8 *)(lVar2 + 0x18),
           *(undefined8 *)(lVar2 + 0x28),pcVar4,pcVar1);
  }
  return 0;
}

Assistant:

const char* to_string_message_severity(VkDebugUtilsMessageSeverityFlagBitsEXT s) {
    switch (s) {
        case VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT:
            return "VERBOSE";
        case VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT:
            return "ERROR";
        case VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT:
            return "WARNING";
        case VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT:
            return "INFO";
        default:
            return "UNKNOWN";
    }
}